

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.h
# Opt level: O2

bool QtPrivate::QTypeNormalizer::skipToken(char **x,char *e,char *token,bool msvcKw)

{
  bool bVar1;
  byte *pbVar2;
  
  bVar1 = starts_with_token(*x,e,token,msvcKw);
  if (bVar1) {
    pbVar2 = (byte *)*x;
    for (; *token != '\0'; token = token + 1) {
      pbVar2 = pbVar2 + 1;
      *x = (char *)pbVar2;
    }
    while (((pbVar2 != (byte *)e && ((ulong)*pbVar2 < 0x21)) &&
           ((0x100000600U >> ((ulong)*pbVar2 & 0x3f) & 1) != 0))) {
      pbVar2 = pbVar2 + 1;
      *x = (char *)pbVar2;
    }
  }
  return bVar1;
}

Assistant:

static constexpr bool skipToken(const char *&x, const char *e, const char *token,
                                    bool msvcKw = false)
    {
        if (!starts_with_token(x, e, token, msvcKw))
            return false;
        while (*token++)
            x++;
        while (x != e && is_space(*x))
            x++;
        return true;
    }